

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

void Gia_ManPrintDivStats(Gia_Man_t *p,Vec_Wec_t *vMffcs,Vec_Wec_t *vPivots)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_00;
  double dVar6;
  double dVar7;
  uint local_40;
  int local_3c;
  int nDivs0;
  int nDivsAll;
  int nDivs;
  int i;
  Vec_Int_t *vMffc;
  int fVerbose;
  Vec_Wec_t *vPivots_local;
  Vec_Wec_t *vMffcs_local;
  Gia_Man_t *p_local;
  
  local_3c = 0;
  local_40 = 0;
  for (nDivsAll = 0; iVar1 = Vec_WecSize(vMffcs), nDivsAll < iVar1; nDivsAll = nDivsAll + 1) {
    p_00 = Vec_WecEntry(vMffcs,nDivsAll);
    iVar1 = Vec_IntSize(p_00);
    iVar3 = Vec_IntEntry(p_00,1);
    iVar4 = Vec_IntEntry(p_00,2);
    iVar4 = ((iVar1 + -3) - iVar3) - iVar4;
    local_40 = (iVar4 == 0) + local_40;
    local_3c = iVar4 + local_3c;
  }
  uVar2 = Vec_WecSize(vMffcs);
  iVar1 = Vec_WecSize(vMffcs);
  iVar3 = Gia_ManAndNum(p);
  iVar4 = Gia_ManAndNum(p);
  iVar5 = Vec_WecSize(vMffcs);
  iVar5 = Abc_MaxInt(1,iVar5 - local_40);
  printf("Collected %d (%.1f %%) MFFCs and %d (%.1f %%) have no divisors (div ave for others is %.2f).\n"
         ,((double)iVar1 * 100.0) / (double)iVar3,((double)(int)local_40 * 100.0) / (double)iVar4,
         ((double)local_3c * 1.0) / (double)iVar5,(ulong)uVar2,(ulong)local_40);
  dVar6 = Vec_WecMemory(vMffcs);
  dVar7 = Vec_WecMemory(vPivots);
  printf("Using %.2f MB for MFFCs and %.2f MB for pivots.   ",dVar6 / 1048576.0,dVar7 / 1048576.0);
  return;
}

Assistant:

void Gia_ManPrintDivStats( Gia_Man_t * p, Vec_Wec_t * vMffcs, Vec_Wec_t * vPivots ) 
{
    int fVerbose = 0;
    Vec_Int_t * vMffc;
    int i, nDivs, nDivsAll = 0, nDivs0 = 0;
    Vec_WecForEachLevel( vMffcs, vMffc, i )
    {
        nDivs = Vec_IntSize(vMffc) - 3 - Vec_IntEntry(vMffc, 1) - Vec_IntEntry(vMffc, 2);
        nDivs0 += (nDivs == 0);
        nDivsAll += nDivs;
        if ( !fVerbose )
            continue;
        printf( "%6d : ",      Vec_IntEntry(vMffc, 0) );
        printf( "Leaf =%3d  ", Vec_IntEntry(vMffc, 1) );
        printf( "Mffc =%4d  ", Vec_IntEntry(vMffc, 2) );
        printf( "Divs =%4d  ", nDivs );
        printf( "\n" );
    }
    printf( "Collected %d (%.1f %%) MFFCs and %d (%.1f %%) have no divisors (div ave for others is %.2f).\n", 
        Vec_WecSize(vMffcs), 100.0 * Vec_WecSize(vMffcs) / Gia_ManAndNum(p), 
        nDivs0, 100.0 * nDivs0 / Gia_ManAndNum(p), 
        1.0*nDivsAll/Abc_MaxInt(1, Vec_WecSize(vMffcs) - nDivs0) );
    printf( "Using %.2f MB for MFFCs and %.2f MB for pivots.   ", 
        Vec_WecMemory(vMffcs)/(1<<20), Vec_WecMemory(vPivots)/(1<<20) );
}